

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

void __thiscall
asio::detail::posix_event::
unlock_and_signal_one<asio::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  ulong uVar1;
  bool bVar2;
  bool have_waiters;
  scoped_lock *lock_local;
  posix_event *this_local;
  
  bVar2 = conditionally_enabled_mutex::scoped_lock::locked(lock);
  if (!bVar2) {
    __assert_fail("lock.locked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/thirdparty/asio/asio/include/asio/detail/posix_event.hpp"
                  ,0x42,
                  "void asio::detail::posix_event::unlock_and_signal_one(Lock &) [Lock = asio::detail::conditionally_enabled_mutex::scoped_lock]"
                 );
  }
  this->state_ = this->state_ | 1;
  uVar1 = this->state_;
  conditionally_enabled_mutex::scoped_lock::unlock(lock);
  if (1 < uVar1) {
    pthread_cond_signal((pthread_cond_t *)this);
  }
  return;
}

Assistant:

void unlock_and_signal_one(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    state_ |= 1;
    bool have_waiters = (state_ > 1);
    lock.unlock();
    if (have_waiters)
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
  }